

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_CollapseExpand(sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
                      Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vNums_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int local_54;
  
  if (fCanon == 0) {
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vLits,fOnOffSetLit);
    }
    vNums_00 = (Vec_Int_t *)(long)nBTLimit;
    iVar3 = sat_solver_solve(pSat,vLits->pArray,vLits->pArray + vLits->nSize,(ABC_INT64_T)vNums_00,0
                             ,0,0);
    if (-1 < fOnOffSetLit) {
      Vec_IntPop(vLits);
    }
    if (iVar3 != -1) {
      if (iVar3 == 0) {
        return -1;
      }
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x1da,
                    "int Bmc_CollapseExpand(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    piVar2 = (pSat->conf_final).ptr;
    uVar1 = (pSat->conf_final).size;
    iVar3 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; iVar3 < vLits->nSize; iVar3 = iVar3 + 1) {
      iVar5 = Vec_IntEntry(vLits,iVar3);
      uVar6 = 0;
      while ((uVar7 = uVar8, uVar8 != uVar6 &&
             (iVar4 = Abc_LitNot(piVar2[uVar6]), uVar7 = uVar6, iVar5 != iVar4))) {
        uVar6 = uVar6 + 1;
      }
      if ((uint)uVar7 == uVar1) {
        Vec_IntWriteEntry(vLits,iVar3,-1);
      }
    }
    iVar3 = Bmc_CollapseExpandRound
                      (pSat,(sat_solver *)0x0,vLits,vNums_00,vTemp,nBTLimit,0,fOnOffSetLit);
  }
  else {
    iVar3 = Bmc_CollapseExpandRound(pSat,pSatOn,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    if (iVar3 == -1) {
      return -1;
    }
    iVar3 = Bmc_CollapseExpandRound
                      (pSat,(sat_solver *)0x0,vLits,(Vec_Int_t *)0xffffffffffffffff,vTemp,nBTLimit,
                       fCanon,-1);
  }
  local_54 = -1;
  if (iVar3 != -1) {
    vNums->nSize = 0;
    local_54 = 0;
    for (iVar3 = 0; iVar3 < vLits->nSize; iVar3 = iVar3 + 1) {
      iVar5 = Vec_IntEntry(vLits,iVar3);
      if (iVar5 != -1) {
        Vec_IntPush(vNums,iVar3);
      }
    }
  }
  return local_54;
}

Assistant:

int Bmc_CollapseExpand( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    // perform one quick reduction if it is non-canonical
    if ( !fCanon )
    {
        int i, k, iLit, status, nFinal, * pFinal;
        // check against offset
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vLits, fOnOffSetLit );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPop( vLits );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );
        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        // mark unused literals
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                Vec_IntWriteEntry( vLits, i, -1 );
        }
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, fOnOffSetLit ) == -1 )
            return -1;
    }
    else
    {
        if ( Bmc_CollapseExpandRound( pSat, pSatOn, vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
    }
    {
        // put into new array
        int i, iLit;
        Vec_IntClear( vNums );
        Vec_IntForEachEntry( vLits, iLit, i )
            if ( iLit != -1 )
                Vec_IntPush( vNums, i );
    }
    return 0;
}